

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O1

bool_t EBML_MasterCheckMandatory(ebml_master *Element,bool_t bWithDefault,int ForProfile)

{
  ebml_master *peVar1;
  bool_t bVar2;
  ebml_master *Element_00;
  bool bVar3;
  
  bVar2 = CheckMandatory(Element,bWithDefault,ForProfile);
  if (bVar2 == 0) {
    bVar2 = 0;
  }
  else {
    Element_00 = (ebml_master *)(Element->Base).Base.Children;
    while (Element_00 != (ebml_master *)0x0) {
      bVar2 = Node_IsPartOf(Element_00,0x544d4245);
      if ((bVar2 != 0) &&
         (bVar2 = EBML_MasterCheckMandatory(Element_00,bWithDefault,ForProfile), bVar2 == 0)) {
        return 0;
      }
      peVar1 = (ebml_master *)(Element_00->Base).Base.Next;
      bVar3 = Element_00 == peVar1;
      Element_00 = peVar1;
      if (bVar3) {
        __assert_fail("(nodetree*)(Child) != ((nodetree*)(Child))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                      ,0xbe,"bool_t EBML_MasterCheckMandatory(const ebml_master *, bool_t, int)");
      }
    }
    bVar2 = 1;
  }
  return bVar2;
}

Assistant:

bool_t EBML_MasterCheckMandatory(const ebml_master *Element, bool_t bWithDefault, int ForProfile)
{
	ebml_element *Child;
	if (!CheckMandatory(Element, bWithDefault, ForProfile))
		return 0;

	for (Child = EBML_MasterChildren(Element); Child; Child = EBML_MasterNext(Child))
	{
		if (Node_IsPartOf(Child,EBML_MASTER_CLASS) && !EBML_MasterCheckMandatory((ebml_master*)Child, bWithDefault, ForProfile))
			return 0;
	}
    return 1;
}